

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

void Rtm_ObjTransferToBig(Rtm_Man_t *p,Rtm_Edg_t *pEdge)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  
  if (((ulong)*pEdge & 0xfff) == 10) {
    if (p->nExtraAlloc <= p->nExtraCur) {
      uVar2 = p->nExtraAlloc * 2;
      uVar4 = 0x400;
      if (0x400 < (int)uVar2) {
        uVar4 = (ulong)uVar2;
      }
      if (p->pExtra == (uint *)0x0) {
        puVar3 = (uint *)malloc(uVar4 * 4);
      }
      else {
        puVar3 = (uint *)realloc(p->pExtra,uVar4 * 4);
      }
      p->pExtra = puVar3;
      p->nExtraAlloc = (int)uVar4;
    }
    p->pExtra[p->nExtraCur] = *(uint *)pEdge >> 0xc;
    iVar1 = p->nExtraCur;
    p->nExtraCur = iVar1 + 1;
    *(uint *)pEdge = *(uint *)pEdge & 0xfff | iVar1 << 0xc;
    return;
  }
  __assert_fail("pEdge->nLats == 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRet.c"
                ,0xb0,"void Rtm_ObjTransferToBig(Rtm_Man_t *, Rtm_Edg_t *)");
}

Assistant:

void Rtm_ObjTransferToBig( Rtm_Man_t * p, Rtm_Edg_t * pEdge ) 
{
    assert( pEdge->nLats == 10 );
    if ( p->nExtraCur + 1 > p->nExtraAlloc )
    {
        int nExtraAllocNew = Abc_MaxInt( 2 * p->nExtraAlloc, 1024 );
        p->pExtra = ABC_REALLOC( unsigned, p->pExtra, nExtraAllocNew );
        p->nExtraAlloc = nExtraAllocNew;
    }
    p->pExtra[p->nExtraCur] = pEdge->LData;
    pEdge->LData = p->nExtraCur++;
}